

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O2

void __thiscall PDFTextString::PDFTextString(PDFTextString *this,string *inString)

{
  (this->mTextString)._M_dataplus._M_p = (pointer)&(this->mTextString).field_2;
  (this->mTextString)._M_string_length = 0;
  (this->mTextString).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

PDFTextString::PDFTextString(const std::string& inString)
{
	mTextString = inString;
}